

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

void __thiscall
FOOLElimination::process
          (FOOLElimination *this,TermList ts,Context context,TermList *termResult,
          Formula **formulaResult)

{
  Formula *pFVar1;
  
  if ((ts._content & 3) != 0) {
    if (context) {
      termResult->_content = (uint64_t)ts;
    }
    else {
      pFVar1 = toEquality(ts);
      *formulaResult = pFVar1;
    }
    return;
  }
  process(this,(Term *)ts._content,context,termResult,formulaResult);
  return;
}

Assistant:

void FOOLElimination::process(TermList ts, Context context, TermList& termResult, Formula*& formulaResult) {
#if VDEBUG
  // A term can only be processed in a formula context if it has boolean sort
  // The opposite does not hold - a boolean term can stand in a term context
  TermList sort = SortHelper::getResultSort(ts, _varSorts);
  if (context == FORMULA_CONTEXT) {
    ASS_REP(sort == AtomicSort::boolSort(), ts.toString());
  }
#endif

  if (!ts.isTerm()) {
    if (context == TERM_CONTEXT) {
      termResult = ts;
    } else {
      formulaResult = toEquality(ts);
    }
    return;
  }

  process(ts.term(), context, termResult, formulaResult);

  if (context == FORMULA_CONTEXT) {
    return;
  }
  // preprocessing of the term does not affect the sort
  //ASS_EQ(sort, SortHelper::getResultSort(termResult, _varSorts));
  //TODO assert that it is a variant
}